

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogSetDefaults(void)

{
  int iVar1;
  xmlCatalogAllow val;
  int iVar2;
  int local_18;
  int n_allow;
  xmlCatalogAllow allow;
  int mem_base;
  int test_ret;
  
  allow = XML_CATA_ALLOW_NONE;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlCatalogAllow(local_18,0);
    xmlCatalogSetDefaults(val);
    call_tests = call_tests + 1;
    des_xmlCatalogAllow(local_18,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaults",(ulong)(uint)(iVar2 - iVar1));
      allow = allow + XML_CATA_ALLOW_GLOBAL;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return allow;
}

Assistant:

static int
test_xmlCatalogSetDefaults(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int mem_base;
    xmlCatalogAllow allow; /* what catalogs should be accepted */
    int n_allow;

    for (n_allow = 0;n_allow < gen_nb_xmlCatalogAllow;n_allow++) {
        mem_base = xmlMemBlocks();
        allow = gen_xmlCatalogAllow(n_allow, 0);

        xmlCatalogSetDefaults(allow);
        call_tests++;
        des_xmlCatalogAllow(n_allow, allow, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogSetDefaults",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_allow);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}